

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O1

int Cec_ManPatComputePattern3_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar3 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar3) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->pTravIds[iVar3] == p->nTravIds) {
    uVar4 = (uint)(*(ulong *)pObj >> 0x1e) & 1 | (uint)(*(ulong *)pObj >> 0x3d) & 2;
  }
  else {
    p->pTravIds[iVar3] = p->nTravIds;
    uVar4 = (uint)*(ulong *)pObj;
    if ((~uVar4 & 0x9fffffff) == 0) {
      *(ulong *)pObj = *(ulong *)pObj | 0x4000000040000000;
      uVar4 = 3;
    }
    else {
      if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecPat.c"
                      ,0x102,"int Cec_ManPatComputePattern3_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar3 = Cec_ManPatComputePattern3_rec(p,pObj + -(ulong)(uVar4 & 0x1fffffff));
      iVar5 = Cec_ManPatComputePattern3_rec
                        (p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
      uVar2 = *(ulong *)pObj;
      uVar4 = (iVar5 == 3 || iVar3 == 3) | 2;
      if (((uint)(uVar2 >> 0x3d) & 1) + 1 == iVar5) {
        uVar4 = 1;
      }
      if ((((uint)uVar2 >> 0x1d & 1) != 0) + 1 == iVar3) {
        uVar4 = 1;
      }
      *(ulong *)pObj =
           (ulong)(uVar4 >> 1) << 0x3e | uVar2 & 0xbfffffffbfffffff | (ulong)((uVar4 & 1) << 0x1e);
    }
  }
  return uVar4;
}

Assistant:

int Cec_ManPatComputePattern3_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int Value0, Value1, Value;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return (pObj->fMark1 << 1) | pObj->fMark0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        pObj->fMark0 = 1;
        pObj->fMark1 = 1;
        return GIA_UND;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Value0 = Cec_ManPatComputePattern3_rec( p, Gia_ObjFanin0(pObj) );
    Value1 = Cec_ManPatComputePattern3_rec( p, Gia_ObjFanin1(pObj) );
    Value = Gia_XsimAndCond( Value0, Gia_ObjFaninC0(pObj), Value1, Gia_ObjFaninC1(pObj) );
    pObj->fMark0 =  (Value & 1);
    pObj->fMark1 = ((Value >> 1) & 1);
    return Value;
}